

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::Node::_set_up_join_counter(Node *this)

{
  bool bVar1;
  size_type sVar2;
  uint *in_RDI;
  bool is_cond;
  size_t i;
  size_t c;
  memory_order __b;
  size_type in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa0;
  uint *puVar3;
  ulong local_38;
  long local_30;
  
  local_30 = 0;
  for (local_38 = *(ulong *)(in_RDI + 0x10);
      sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                        ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_stack_ffffffffffffffa0),
      local_38 < sVar2; local_38 = local_38 + 1) {
    SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
              ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    bVar1 = _is_conditioner(in_stack_ffffffffffffffa0);
    *in_RDI = *in_RDI + (uint)bVar1 | (uint)bVar1 << 0x1c;
    local_30 = (ulong)((bVar1 ^ 0xffU) & 1) + local_30;
  }
  puVar3 = in_RDI + 0x20;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(long *)puVar3 = local_30;
  return;
}

Assistant:

inline void Node::_set_up_join_counter() {
  size_t c = 0;
  //for(auto p : _predecessors) {
  for(size_t i=_num_successors; i<_edges.size(); i++) {
    bool is_cond = _edges[i]->_is_conditioner();
    _nstate = (_nstate + is_cond) | (is_cond * NSTATE::CONDITIONED);  // weak dependency
    c += !is_cond;  // strong dependency
  }
  _join_counter.store(c, std::memory_order_relaxed);
}